

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Multi_field_small.h
# Opt level: O3

Multi_field_element_with_small_characteristics<5U,_13U,_unsigned_int,_void> __thiscall
Gudhi::persistence_fields::
Multi_field_element_with_small_characteristics<5U,_13U,_unsigned_int,_void>::
get_partial_multiplicative_identity
          (Multi_field_element_with_small_characteristics<5U,_13U,_unsigned_int,_void> *this,
          Characteristic *productOfCharacteristics)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  bool bVar6;
  
  if (*productOfCharacteristics == 0) {
    uVar5 = 1;
  }
  else if ((long)primes_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)primes_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start == 0) {
    uVar5 = 0;
  }
  else {
    uVar4 = 0;
    uVar5 = 0;
    do {
      if (*productOfCharacteristics %
          primes_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar4] == 0) {
        uVar1 = partials_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar4];
        uVar2 = uVar1 % 0x138d;
        if (uVar1 < 0x138d) {
          uVar2 = uVar1;
        }
        uVar3 = uVar5 + uVar2;
        uVar1 = uVar3;
        if (0x138c < uVar3) {
          uVar1 = uVar3 - 0x138d;
        }
        bVar6 = CARRY4(uVar2,uVar5);
        uVar5 = uVar1;
        if (bVar6) {
          uVar5 = uVar3 - 0x138d;
        }
      }
      uVar4 = uVar4 + 1;
    } while ((uVar4 & 0xffffffff) <
             (ulong)((long)primes_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)primes_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_start >> 2));
  }
  this->element_ = uVar5;
  return (Multi_field_element_with_small_characteristics<5U,_13U,_unsigned_int,_void>)
         (Element_conflict)this;
}

Assistant:

static Multi_field_element_with_small_characteristics get_partial_multiplicative_identity(
      const Characteristic& productOfCharacteristics) {
    if (productOfCharacteristics == 0) {
      return Multi_field_element_with_small_characteristics<minimum, maximum>(multiplicativeID_);
    }
    Multi_field_element_with_small_characteristics<minimum, maximum> mult;
    for (Characteristic idx = 0; idx < primes_.size(); ++idx) {
      if ((productOfCharacteristics % primes_[idx]) == 0) {
        mult += partials_[idx];
      }
    }
    return mult;
  }